

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O1

int ncnn::deconvolution1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  float *pfVar17;
  void *pvVar18;
  ulong uVar19;
  float *pfVar20;
  float *pfVar21;
  ulong uVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  float fVar29;
  int iVar30;
  int iVar32;
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int size;
  
  uVar2 = top_blob->h;
  if (bias_data->data == (void *)0x0) {
    bVar23 = true;
    uVar13 = (ulong)uVar2;
  }
  else {
    uVar13 = (long)bias_data->c * bias_data->cstep;
    bVar23 = uVar13 == 0;
  }
  iVar12 = (int)uVar13;
  if (0 < (int)uVar2) {
    uVar3 = bottom_blob->w;
    uVar4 = bottom_blob->h;
    uVar5 = top_blob->w;
    uVar6 = top_blob->w;
    pfVar20 = (float *)top_blob->data;
    pvVar7 = bias_data->data;
    pvVar8 = weight_data->data;
    lVar14 = (ulong)uVar6 - 1;
    auVar31._8_4_ = (int)lVar14;
    auVar31._0_8_ = lVar14;
    auVar31._12_4_ = (int)((ulong)lVar14 >> 0x20);
    lVar14 = (long)(int)uVar6 * top_blob->elemsize;
    auVar31 = auVar31 ^ _DAT_005f00e0;
    pfVar17 = pfVar20 + 3;
    iVar12 = 0;
    uVar13 = 0;
    auVar33 = _DAT_005f0720;
    auVar34 = _DAT_005f0730;
    auVar35 = _DAT_005f00e0;
    do {
      fVar25 = 0.0;
      if (!bVar23) {
        fVar25 = *(float *)((long)pvVar7 + uVar13 * 4);
      }
      if (0 < (int)uVar6) {
        uVar15 = 0;
        do {
          auVar26._8_4_ = (int)uVar15;
          auVar26._0_8_ = uVar15;
          auVar26._12_4_ = (int)(uVar15 >> 0x20);
          auVar27 = (auVar26 | auVar34) ^ auVar35;
          iVar30 = auVar31._0_4_;
          bVar11 = iVar30 < auVar27._0_4_;
          iVar28 = auVar27._4_4_;
          iVar32 = auVar31._4_4_;
          if ((bool)(~(iVar32 < iVar28 || iVar28 == iVar32 && bVar11) & 1)) {
            pfVar17[uVar15 - 3] = fVar25;
          }
          if (iVar32 >= iVar28 && (iVar28 != iVar32 || !bVar11)) {
            pfVar17[uVar15 - 2] = fVar25;
          }
          auVar26 = (auVar26 | auVar33) ^ auVar35;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar32 && (iVar28 != iVar32 || auVar26._0_4_ <= iVar30)) {
            pfVar17[uVar15 - 1] = fVar25;
            pfVar17[uVar15] = fVar25;
          }
          uVar15 = uVar15 + 4;
        } while ((uVar6 + 3 & 0xfffffffc) != uVar15);
      }
      if (0 < (int)uVar3) {
        pvVar9 = bottom_blob->data;
        iVar28 = bottom_blob->w;
        sVar10 = bottom_blob->elemsize;
        uVar15 = 0;
        pfVar16 = pfVar20;
        do {
          if (0 < (int)uVar4) {
            uVar19 = 0;
            pvVar18 = (void *)((long)pvVar8 + (long)iVar12 * 4);
            do {
              if (0 < kernel_w) {
                fVar25 = *(float *)((long)pvVar9 + (long)iVar28 * sVar10 * uVar19 + uVar15 * 4);
                uVar22 = 0;
                pfVar21 = pfVar16;
                do {
                  *pfVar21 = *(float *)((long)pvVar18 + uVar22 * 4) * fVar25 + *pfVar21;
                  uVar22 = uVar22 + 1;
                  pfVar21 = pfVar21 + dilation_w;
                } while ((uint)kernel_w != uVar22);
              }
              uVar19 = uVar19 + 1;
              pvVar18 = (void *)((long)pvVar18 + (long)kernel_w * 4);
            } while (uVar19 != uVar4);
          }
          uVar15 = uVar15 + 1;
          pfVar16 = pfVar16 + stride_w;
        } while (uVar15 != uVar3);
      }
      if (0 < (int)uVar5) {
        pfVar16 = (float *)activation_params->data;
        uVar15 = 0;
        do {
          fVar25 = pfVar20[uVar15];
          fVar24 = fVar25;
          switch(activation_type) {
          case 1:
            if (fVar25 <= 0.0) {
              fVar24 = 0.0;
            }
            break;
          case 2:
            fVar24 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar16 |
                            -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
            break;
          case 3:
            if (fVar25 <= *pfVar16) {
              fVar25 = *pfVar16;
            }
            fVar24 = pfVar16[1];
            if (fVar25 <= pfVar16[1]) {
              fVar24 = fVar25;
            }
            break;
          case 4:
            if (88.37626 <= fVar25) {
              fVar25 = 88.37626;
            }
            fVar25 = expf((float)(-(uint)(fVar25 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar25 < -88.37626) & ((uint)fVar25 ^ auVar35._0_4_)));
            auVar33 = _DAT_005f0720;
            auVar34 = _DAT_005f0730;
            auVar35 = _DAT_005f00e0;
            fVar24 = 1.0 / (fVar25 + 1.0);
            break;
          case 5:
            fVar24 = expf(fVar25);
            fVar24 = logf(fVar24 + 1.0);
            fVar24 = tanhf(fVar24);
            auVar33 = _DAT_005f0720;
            auVar34 = _DAT_005f0730;
            auVar35 = _DAT_005f00e0;
            fVar24 = fVar24 * fVar25;
            break;
          case 6:
            fVar1 = *pfVar16;
            fVar29 = (float)((uint)pfVar16[1] ^ auVar35._0_4_) / fVar1;
            fVar24 = 0.0;
            if ((fVar29 <= fVar25) && (fVar24 = fVar25, fVar25 <= fVar29 + 1.0 / fVar1)) {
              fVar24 = (fVar1 * fVar25 + pfVar16[1]) * fVar25;
            }
          }
          pfVar20[uVar15] = fVar24;
          uVar15 = uVar15 + 1;
        } while (uVar5 != uVar15);
      }
      uVar13 = uVar13 + 1;
      pfVar17 = (float *)((long)pfVar17 + lVar14);
      pfVar20 = (float *)((long)pfVar20 + lVar14);
      iVar12 = iVar12 + uVar4 * kernel_w;
    } while (uVar13 != uVar2);
  }
  return iVar12;
}

Assistant:

static int deconvolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        Mat out = top_blob.row_range(p, 1);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int j = 0; j < w; j++)
        {
            float* outptr = (float*)out + j * stride_w;

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float val = bottom_blob.row(q)[j];

                for (int k = 0; k < kernel_w; k++)
                {
                    float w = kptr[k];
                    outptr[k * dilation_w] += val * w;
                }

                kptr += kernel_w;
            }
        }

        {
            float* outptr = out;

            for (int i = 0; i < outw; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}